

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O2

void __thiscall
WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
          (TypedRegisterAllocator *this,AsmJsFunctionInfo *funcInfo,FunctionBody *body)

{
  Type TVar1;
  RegSlot RVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  code *pcVar7;
  bool bVar8;
  uint uVar9;
  LocalFunctionId LVar10;
  int iVar11;
  uint32 uVar12;
  uint uVar13;
  uint32 uVar14;
  uint32 uVar15;
  undefined4 extraout_var;
  TypedSlotInfo *pTVar16;
  RegisterSpace *pRVar17;
  undefined4 extraout_var_00;
  undefined4 *puVar18;
  Types type;
  long lVar19;
  char16 local_a8 [4];
  char16 buf [16];
  undefined1 local_80 [8];
  TypedConstSourcesInfo constSourcesInfo;
  uint local_34;
  
  GetConstSourceInfos((TypedConstSourcesInfo *)local_80,this);
  uVar9 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
  constSourcesInfo._16_8_ = &DAT_01453738;
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsInterpreterStackPhase,uVar9,LVar10);
  if (bVar8) {
    iVar11 = (*(body->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(body);
    Output::Print(L"ASMFunctionInfo Stack Data for %s\n",CONCAT44(extraout_var,iVar11));
    Output::Print(L"==========================\n");
    Output::Print(L"RequiredVarConstants:%d\n",5);
  }
  local_34 = 0x28;
  lVar19 = 0;
  do {
    if (lVar19 == 5) {
      Js::AsmJsFunctionInfo::SetTotalSizeinBytes(funcInfo,local_34);
      uVar12 = ConvertOffset<unsigned_char,void*>(constSourcesInfo.srcByteOffsets[3]);
      uVar14 = ConvertOffset<unsigned_char,void*>(local_34);
      uVar13 = uVar14 - uVar12;
      if (uVar14 < uVar12) {
        uVar13 = 0;
      }
      if (uVar13 + uVar12 < uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar18 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WAsmjsUtils.cpp"
                           ,0x135,
                           "((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded)",
                           "(jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded");
        if (!bVar8) {
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar18 = 0;
      }
      Js::FunctionBody::CheckAndSetVarCount(body,uVar13);
      uVar9 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
      LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsInterpreterStackPhase,uVar9,LVar10)
      ;
      if (bVar8) {
        Output::Print(L"Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"
                      ,(ulong)uVar12,(ulong)uVar13,(ulong)uVar14,(ulong)local_34);
      }
      return;
    }
    type = (Types)lVar19;
    pTVar16 = Js::AsmJsFunctionInfo::GetTypedSlotInfo(funcInfo,type);
    if ((this->mExcludedMask >> (type & 0x1f) & 1) == 0) {
      pRVar17 = GetRegisterSpace(this,type);
      TVar1 = pRVar17->mNbConst;
      pTVar16->constCount = TVar1;
      RVar2 = pRVar17->mFirstTmpReg;
      pTVar16->varCount = RVar2 - TVar1;
      pTVar16->tmpCount = pRVar17->mRegisterCount - RVar2;
      pTVar16->constSrcByteOffset = *(Type *)(local_80 + lVar19 * 4);
      uVar12 = GetTypeByteSize(type);
      uVar13 = Math::AlignOverflowCheck<unsigned_int>(local_34,uVar12);
      pTVar16->byteOffset = uVar13;
      uVar12 = UInt32Math::Add(pTVar16->constCount,pTVar16->varCount);
      uVar12 = UInt32Math::Add(uVar12,pTVar16->tmpCount);
      uVar14 = GetTypeByteSize(type);
      lVar6 = (ulong)uVar12 * (ulong)uVar14;
      if ((int)((ulong)lVar6 >> 0x20) != 0) {
        Math::DefaultOverflowPolicy();
      }
      local_34 = UInt32Math::Add(uVar13,(uint32)lVar6);
      uVar9 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
      LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
      bVar8 = Js::Phases::IsEnabled
                        ((Phases *)constSourcesInfo._16_8_,AsmjsInterpreterStackPhase,uVar9,LVar10);
      if (bVar8) {
        RegisterSpace::GetTypeDebugName(type,local_a8,0x10,false);
        uVar13 = pTVar16->byteOffset;
        uVar3 = pTVar16->constCount;
        uVar4 = pTVar16->varCount;
        uVar5 = pTVar16->tmpCount;
        uVar14 = GetTypeByteSize(type);
        uVar15 = GetTypeByteSize(type);
        Output::Print(L"%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"
                      ,local_a8,(ulong)uVar13,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar12,
                      CONCAT44(extraout_var_00,uVar14),(ulong)(uVar15 * uVar12));
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void TypedRegisterAllocator::CommitToFunctionInfo(Js::AsmJsFunctionInfo* funcInfo, Js::FunctionBody* body) const
    {
        uint32 offset = Js::AsmJsFunctionMemory::RequiredVarConstants * sizeof(Js::Var);
        WAsmJs::TypedConstSourcesInfo constSourcesInfo = GetConstSourceInfos();

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("ASMFunctionInfo Stack Data for %s\n"), body->GetDisplayName());
            Output::Print(_u("==========================\n"));
            Output::Print(_u("RequiredVarConstants:%d\n"), Js::AsmJsFunctionMemory::RequiredVarConstants);
        }
#endif

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            Types type = (Types)i;

            TypedSlotInfo& slotInfo = *funcInfo->GetTypedSlotInfo(type);
            // Check if we don't want to commit this type
            if (!IsTypeExcluded(type))
            {
                RegisterSpace* registerSpace = GetRegisterSpace(type);
                slotInfo.constCount = registerSpace->GetConstCount();
                slotInfo.varCount = registerSpace->GetVarCount();
                slotInfo.tmpCount = registerSpace->GetTmpCount();
                slotInfo.constSrcByteOffset = constSourcesInfo.srcByteOffsets[i];

                offset = Math::AlignOverflowCheck(offset, GetTypeByteSize(type));
                slotInfo.byteOffset = offset;

                // Update offset for next type
                uint32 totalTypeCount = 0;
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.constCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.varCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.tmpCount);

                offset = UInt32Math::Add(offset, UInt32Math::Mul(totalTypeCount, GetTypeByteSize(type)));
#if DBG_DUMP
                if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
                {
                    char16 buf[16];
                    RegisterSpace::GetTypeDebugName(type, buf, 16);
                    Output::Print(_u("%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"),
                                  buf,
                                  slotInfo.byteOffset,
                                  slotInfo.constCount,
                                  slotInfo.varCount,
                                  slotInfo.tmpCount,
                                  totalTypeCount,
                                  GetTypeByteSize(type),
                                  totalTypeCount * GetTypeByteSize(type));
                }
#endif
            }
        }

        // The offset currently carries the total size of the funcInfo after handling the last type
        funcInfo->SetTotalSizeinBytes(offset);

        // These bytes offset already calculated the alignment, used them to determine how many Js::Var we need to do the allocation
        uint32 stackByteSize = offset;
        uint32 bytesUsedForConst = constSourcesInfo.bytesUsed;
        uint32 jsVarUsedForConstsTable = ConvertOffset<byte, Js::Var>(bytesUsedForConst);
        uint32 totalVarsNeeded = ConvertOffset<byte, Js::Var>(stackByteSize);

        uint32 jsVarNeededForVars = totalVarsNeeded - jsVarUsedForConstsTable;
        if (totalVarsNeeded < jsVarUsedForConstsTable)
        {
            // If for some reason we allocated more space in the const table than what we need, just don't allocate anymore vars
            jsVarNeededForVars = 0;
        }

        Assert((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded);
        body->CheckAndSetVarCount(jsVarNeededForVars);

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"),
                          jsVarUsedForConstsTable,
                          jsVarNeededForVars,
                          totalVarsNeeded,
                          stackByteSize);
        }
#endif
    }